

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

char * __thiscall cmTarget::GetLocationForBuild(cmTarget *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *this_00;
  bool bVar3;
  int iVar4;
  char *__s1;
  string macdir;
  size_type __dnew;
  string local_88;
  string local_68;
  string local_48;
  
  if (GetLocationForBuild()::location_abi_cxx11_ == '\0') {
    GetLocationForBuild();
  }
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  if (this->IsImportedTarget == true) {
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    ImportedGetFullPath(&local_88,this,&local_68,false);
    std::__cxx11::string::operator=
              ((string *)&GetLocationForBuild()::location_abi_cxx11_,(string *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) goto LAB_00366051;
  }
  else {
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    GetDirectory(&local_88,this,&local_68,false);
    std::__cxx11::string::operator=
              ((string *)&GetLocationForBuild()::location_abi_cxx11_,(string *)&local_88);
    paVar2 = &local_88.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar2) {
      operator_delete(local_88._M_dataplus._M_p,(ulong)(local_88.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
    this_00 = this->Makefile;
    local_68._M_dataplus._M_p = (pointer)0x10;
    local_88._M_dataplus._M_p = (pointer)paVar2;
    local_88._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&local_68);
    local_88.field_2._M_allocated_capacity = (size_type)local_68._M_dataplus._M_p;
    builtin_strncpy(local_88._M_dataplus._M_p,"CMAKE_CFG_INTDIR",0x10);
    local_88._M_string_length = (size_type)local_68._M_dataplus._M_p;
    local_88._M_dataplus._M_p[(long)local_68._M_dataplus._M_p] = '\0';
    __s1 = cmMakefile::GetDefinition(this_00,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar2) {
      operator_delete(local_88._M_dataplus._M_p,(ulong)(local_88.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((__s1 != (char *)0x0) && (iVar4 = strcmp(__s1,"."), iVar4 != 0)) {
      std::__cxx11::string::append((char *)&GetLocationForBuild()::location_abi_cxx11_);
      std::__cxx11::string::append((char *)&GetLocationForBuild()::location_abi_cxx11_);
    }
    bVar3 = IsAppBundleOnApple(this);
    if (bVar3) {
      local_68._M_string_length = 0;
      local_68.field_2._M_local_buf[0] = '\0';
      local_48._M_string_length = 0;
      local_48.field_2._M_local_buf[0] = '\0';
      local_68._M_dataplus._M_p = (pointer)paVar1;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      BuildMacContentDirectory(&local_88,this,&local_68,&local_48,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,
                        CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                                 local_48.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,
                        CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                 local_68.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_string_length !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::__cxx11::string::append((char *)&GetLocationForBuild()::location_abi_cxx11_);
        std::__cxx11::string::_M_append
                  ((char *)&GetLocationForBuild()::location_abi_cxx11_,
                   (ulong)local_88._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar2) {
        operator_delete(local_88._M_dataplus._M_p,
                        (ulong)(local_88.field_2._M_allocated_capacity + 1));
      }
    }
    std::__cxx11::string::append((char *)&GetLocationForBuild()::location_abi_cxx11_);
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    local_68._M_dataplus._M_p = (pointer)paVar1;
    GetFullName(&local_88,this,&local_68,false);
    std::__cxx11::string::_M_append
              ((char *)&GetLocationForBuild()::location_abi_cxx11_,(ulong)local_88._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == paVar2) goto LAB_00366051;
  }
  operator_delete(local_88._M_dataplus._M_p,(ulong)(local_88.field_2._M_allocated_capacity + 1));
LAB_00366051:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return GetLocationForBuild()::location_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

const char* cmTarget::GetLocationForBuild() const
{
  static std::string location;
  if(this->IsImported())
    {
    location = this->ImportedGetFullPath("", false);
    return location.c_str();
    }

  // Now handle the deprecated build-time configuration location.
  location = this->GetDirectory();
  const char* cfgid = this->Makefile->GetDefinition("CMAKE_CFG_INTDIR");
  if(cfgid && strcmp(cfgid, ".") != 0)
    {
    location += "/";
    location += cfgid;
    }

  if(this->IsAppBundleOnApple())
    {
    std::string macdir = this->BuildMacContentDirectory("", "", false);
    if(!macdir.empty())
      {
      location += "/";
      location += macdir;
      }
    }
  location += "/";
  location += this->GetFullName("", false);
  return location.c_str();
}